

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O1

size_t __thiscall Diligent::StringPool::GetRemainingSize(StringPool *this)

{
  string msg;
  string local_30;
  
  if (this->m_pBuffer + this->m_ReservedSize < this->m_pCurrPtr) {
    FormatString<char[16]>(&local_30,(char (*) [16])"Buffer overflow");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetRemainingSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x9c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return (size_t)(this->m_pBuffer + (this->m_ReservedSize - (long)this->m_pCurrPtr));
}

Assistant:

size_t GetRemainingSize() const
    {
        VERIFY(m_pCurrPtr <= m_pBuffer + m_ReservedSize, "Buffer overflow");
        return m_ReservedSize - (m_pCurrPtr - m_pBuffer);
    }